

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

void __thiscall bloaty::Options::Options(Options *this,Options *from)

{
  void *pvVar1;
  string *psVar2;
  uint64 uVar3;
  int iVar4;
  int iVar5;
  int32 iVar6;
  bool bVar7;
  undefined3 uVar8;
  uint uVar9;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Options_00620300;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->filename_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->filename_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->filename_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->filename_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->filename_).super_RepeatedPtrFieldBase,
             &(from->filename_).super_RepeatedPtrFieldBase);
  (this->base_filename_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->base_filename_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->base_filename_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->base_filename_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->base_filename_).super_RepeatedPtrFieldBase,
             &(from->base_filename_).super_RepeatedPtrFieldBase);
  (this->data_source_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->data_source_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->data_source_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->data_source_).super_RepeatedPtrFieldBase,
             &(from->data_source_).super_RepeatedPtrFieldBase);
  (this->custom_data_source_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->custom_data_source_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
            (&(this->custom_data_source_).super_RepeatedPtrFieldBase,
             &(from->custom_data_source_).super_RepeatedPtrFieldBase);
  (this->debug_filename_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->debug_filename_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->debug_filename_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->debug_filename_).super_RepeatedPtrFieldBase,
             &(from->debug_filename_).super_RepeatedPtrFieldBase);
  (this->source_map_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->source_map_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->source_map_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->source_map_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->source_map_).super_RepeatedPtrFieldBase,
             &(from->source_map_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->disassemble_function_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar9 = (from->_has_bits_).has_bits_[0];
  if (((uVar9 & 1) != 0) &&
     (psVar2 = (from->disassemble_function_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->disassemble_function_,psVar2);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->source_filter_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if (((uVar9 & 2) != 0) &&
     (psVar2 = (from->source_filter_).ptr_,
     psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->source_filter_,psVar2);
  }
  this->max_rows_per_level_ = from->max_rows_per_level_;
  iVar4 = from->demangle_;
  iVar5 = from->sort_by_;
  iVar6 = from->verbose_level_;
  bVar7 = from->dump_raw_map_;
  uVar8 = *(undefined3 *)&from->field_0xc5;
  uVar3 = from->debug_fileoff_;
  this->debug_vmaddr_ = from->debug_vmaddr_;
  this->debug_fileoff_ = uVar3;
  this->demangle_ = iVar4;
  this->sort_by_ = iVar5;
  this->verbose_level_ = iVar6;
  this->dump_raw_map_ = bVar7;
  *(undefined3 *)&this->field_0xc5 = uVar8;
  return;
}

Assistant:

Options::Options(const Options& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      filename_(from.filename_),
      base_filename_(from.base_filename_),
      data_source_(from.data_source_),
      custom_data_source_(from.custom_data_source_),
      debug_filename_(from.debug_filename_),
      source_map_(from.source_map_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  disassemble_function_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_disassemble_function()) {
    disassemble_function_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.disassemble_function_);
  }
  source_filter_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_source_filter()) {
    source_filter_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.source_filter_);
  }
  ::memcpy(&demangle_, &from.demangle_,
    static_cast<size_t>(reinterpret_cast<char*>(&max_rows_per_level_) -
    reinterpret_cast<char*>(&demangle_)) + sizeof(max_rows_per_level_));
  // @@protoc_insertion_point(copy_constructor:bloaty.Options)
}